

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O0

int xSAT_SolverAddClause(xSAT_Solver_t *s,Vec_Int_t *vLits)

{
  Vec_Str_t *pVVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int local_30;
  int MaxVar;
  int PrevLit;
  int Lit;
  int j;
  int i;
  Vec_Int_t *vLits_local;
  xSAT_Solver_t *s_local;
  
  Vec_IntSort(vLits,0);
  iVar3 = Vec_IntEntryLast(vLits);
  iVar3 = xSAT_Lit2Var(iVar3);
  while (iVar4 = Vec_IntSize(s->vActivity), iVar4 <= iVar3) {
    xSAT_SolverAddVariable(s,1);
  }
  PrevLit = 0;
  local_30 = -2;
  Lit = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vLits);
    if (iVar3 <= Lit) {
      Vec_IntShrink(vLits,PrevLit);
      iVar3 = Vec_IntSize(vLits);
      if (iVar3 == 0) {
        s_local._4_4_ = 0;
      }
      else {
        iVar3 = Vec_IntSize(vLits);
        if (iVar3 == 1) {
          iVar3 = Vec_IntEntry(vLits,0);
          xSAT_SolverEnqueue(s,iVar3,0xffffffff);
          uVar5 = xSAT_SolverPropagate(s);
          s_local._4_4_ = (uint)(uVar5 == 0xffffffff);
        }
        else {
          xSAT_SolverClaNew(s,vLits,0);
          s_local._4_4_ = 1;
        }
      }
      return s_local._4_4_;
    }
    iVar3 = Vec_IntEntry(vLits,Lit);
    iVar4 = xSAT_NegLit(local_30);
    if (iVar3 == iVar4) break;
    pVVar1 = s->vAssigns;
    iVar4 = xSAT_Lit2Var(iVar3);
    cVar2 = Vec_StrEntry(pVVar1,iVar4);
    iVar4 = xSAT_LitSign(iVar3);
    if (cVar2 == iVar4) {
      return 1;
    }
    if (iVar3 != local_30) {
      pVVar1 = s->vAssigns;
      iVar4 = xSAT_Lit2Var(iVar3);
      cVar2 = Vec_StrEntry(pVVar1,iVar4);
      if (cVar2 == '\x03') {
        Vec_IntWriteEntry(vLits,PrevLit,iVar3);
        local_30 = iVar3;
        PrevLit = PrevLit + 1;
      }
    }
    Lit = Lit + 1;
  }
  return 1;
}

Assistant:

int xSAT_SolverAddClause( xSAT_Solver_t * s, Vec_Int_t * vLits )
{
    int i, j;
    int Lit, PrevLit;
    int MaxVar;

    Vec_IntSort( vLits, 0 );
    MaxVar = xSAT_Lit2Var( Vec_IntEntryLast( vLits ) );
    while ( MaxVar >= Vec_IntSize( s->vActivity ) )
        xSAT_SolverAddVariable( s, 1 );

    j = 0;
    PrevLit = LitUndef;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        if ( Lit == xSAT_NegLit( PrevLit ) || Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == xSAT_LitSign( Lit ) )
            return true;
        else if ( Lit != PrevLit && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == VarX )
        {
            PrevLit = Lit;
            Vec_IntWriteEntry( vLits, j++, Lit );
        }
    }
    Vec_IntShrink( vLits, j );

    if ( Vec_IntSize( vLits ) == 0 )
        return false;
    if ( Vec_IntSize( vLits ) == 1 )
    {
        xSAT_SolverEnqueue( s, Vec_IntEntry( vLits, 0 ), CRefUndef );
        return ( xSAT_SolverPropagate( s ) == CRefUndef );
    }

    xSAT_SolverClaNew( s, vLits, 0 );
    return true;
}